

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void Lowerer::GenerateLdFldFromProtoInlineCache
               (Instr *instrLdFld,RegOpnd *opndBase,Opnd *opndDst,RegOpnd *inlineCache,
               LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE BVar1;
  DWORD offset;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar2;
  RegOpnd *indexOpnd;
  RegOpnd *opndSlotIndex;
  RegOpnd *opndProto;
  RegOpnd *opndProtoSlots;
  IndirOpnd *opndIndir;
  bool isInlineSlot_local;
  LabelInstr *labelFallThru_local;
  RegOpnd *inlineCache_local;
  Opnd *opndDst_local;
  RegOpnd *opndBase_local;
  Instr *instrLdFld_local;
  
  opndProto = (RegOpnd *)0x0;
  baseOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar2 = IR::IndirOpnd::New(inlineCache,0x10,TyInt64,instrLdFld->m_func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  if (!isInlineSlot) {
    opndProto = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar2 = IR::IndirOpnd::New(baseOpnd,offset,TyInt64,instrLdFld->m_func,false);
    InsertMove(&opndProto->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  }
  indexOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar2 = IR::IndirOpnd::New(inlineCache,2,TyUint16,instrLdFld->m_func,false);
  InsertMove(&indexOpnd->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  if (isInlineSlot) {
    BVar1 = LowererMD::GetDefaultIndirScale();
    pIVar2 = IR::IndirOpnd::New(baseOpnd,indexOpnd,BVar1,TyInt64,instrLdFld->m_func);
    InsertMove(opndDst,&pIVar2->super_Opnd,instrLdFld,true);
  }
  else {
    BVar1 = LowererMD::GetDefaultIndirScale();
    pIVar2 = IR::IndirOpnd::New(opndProto,indexOpnd,BVar1,TyInt64,instrLdFld->m_func);
    InsertMove(opndDst,&pIVar2->super_Opnd,instrLdFld,true);
  }
  InsertBranch(Br,labelFallThru,instrLdFld);
  return;
}

Assistant:

void
Lowerer::GenerateLdFldFromProtoInlineCache(
    IR::Instr * instrLdFld,
    IR::RegOpnd * opndBase,
    IR::Opnd * opndDst,
    IR::RegOpnd * inlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV [&(inlineCache->u.proto.prototypeObject)] -- load the cached prototype object
    // s1 = MOV [&s1->slots] -- load the slot array
    // s2 = MOVZXW [&(inlineCache->u.proto.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2*4]
    //      JMP $fallthru

    IR::IndirOpnd * opndIndir = nullptr;
    IR::RegOpnd * opndProtoSlots = nullptr;

    // s1 = MOV [&(inlineCache->u.proto.prototypeObject)] -- load the cached prototype object
    IR::RegOpnd * opndProto = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(inlineCache, (int32)offsetof(Js::InlineCache, u.proto.prototypeObject), TyMachReg, instrLdFld->m_func);
    InsertMove(opndProto, opndIndir, instrLdFld);

    if (!isInlineSlot)
    {
        // s1 = MOV [&s1->slots] -- load the slot array
        opndProtoSlots = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
        opndIndir = IR::IndirOpnd::New(opndProto, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndProtoSlots, opndIndir, instrLdFld);
    }

    // s2 = MOVZXW [&(inlineCache->u.proto.slotIndex)] -- load the cached slot index
    IR::RegOpnd * opndSlotIndex = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(inlineCache, (int32)offsetof(Js::InlineCache, u.proto.slotIndex), TyUint16, instrLdFld->m_func);
    InsertMove(opndSlotIndex, opndIndir, instrLdFld);

    if (isInlineSlot)
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndProto, opndSlotIndex, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }
    else
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndProtoSlots, opndSlotIndex, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, instrLdFld);
}